

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void check_and_fix(Am_Value_List *list,Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  undefined1 local_28 [8];
  Am_Value item;
  Am_Object *inter_local;
  Am_Value_List *list_local;
  
  item.value = (anon_union_8_8_ea4c8939_for_value)inter;
  Am_Value::Am_Value((Am_Value *)local_28);
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0033a11a:
      Am_Value::~Am_Value((Am_Value *)local_28);
      return;
    }
    in_value = Am_Value_List::Get(list);
    Am_Value::operator=((Am_Value *)local_28,in_value);
    if (local_28._0_2_ == 0x8008) {
      do_fix_all(list,(Am_Object *)item.value.wrapper_value);
      goto LAB_0033a11a;
    }
    bVar1 = Am_Input_Char::Test((Am_Value *)local_28);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"item in Am_SELECTION_MOVE_CHARS of ");
      poVar2 = operator<<(poVar2,(Am_Object *)item.value.wrapper_value);
      poVar2 = std::operator<<(poVar2," is not a string or Am_Input_Char, is : ");
      poVar2 = operator<<(poVar2,(Am_Value *)local_28);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
check_and_fix(Am_Value_List &list, Am_Object &inter)
{
  Am_Value item;
  for (list.Start(); !list.Last(); list.Next()) {
    item = list.Get();
    if (item.type == Am_STRING) {
      do_fix_all(list, inter);
      return;
    } else if (!Am_Input_Char::Test(item))
      Am_ERRORO("item in Am_SELECTION_MOVE_CHARS of "
                    << inter
                    << " is not a string or Am_Input_Char, is : " << item,
                inter, Am_SELECTION_MOVE_CHARS);
  }
}